

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openjpeg.c
# Opt level: O3

void opj_destroy_codec(opj_codec_t *p_codec)

{
  if (p_codec != (opj_codec_t *)0x0) {
    (*(code *)p_codec[(ulong)(*(int *)(p_codec + 0x12) != 0) + 4])(p_codec[0xb]);
    p_codec[0xb] = (opj_codec_t)0x0;
    opj_free(p_codec);
    return;
  }
  return;
}

Assistant:

void OPJ_CALLCONV opj_destroy_codec(opj_codec_t *p_codec)
{
    if (p_codec) {
        opj_codec_private_t * l_codec = (opj_codec_private_t *) p_codec;

        if (l_codec->is_decompressor) {
            l_codec->m_codec_data.m_decompression.opj_destroy(l_codec->m_codec);
        } else {
            l_codec->m_codec_data.m_compression.opj_destroy(l_codec->m_codec);
        }

        l_codec->m_codec = 00;
        opj_free(l_codec);
    }
}